

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void __thiscall kratos::AssertionVisitor::~AssertionVisitor(AssertionVisitor *this)

{
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002ab378;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(AssertBase *stmt) override {
        if (stmt->fn_name_ln.empty()) return;
        auto *generator = stmt->generator_parent();
        if (!generator->has_function(hgdb_assert_fail)) {
            generator->builtin_function(hgdb_assert_fail);
        }
        auto const &[filename, line_num] = stmt->fn_name_ln[0];
        auto filename_var = Const::constant(filename, filename.size() * 8).shared_from_this();
        auto line_num_var =
            Const::constant(static_cast<int64_t>(line_num), 32, false).shared_from_this();
        auto gen_var = std::make_shared<GeneratorConst>(*generator);
        auto else_call = stmt->generator_parent()
                             ->call(hgdb_assert_fail, {gen_var, filename_var, line_num_var})
                             .as<FunctionCallVar>();
        auto else_stmt = std::make_shared<FunctionCallStmt>(else_call);
        if (stmt->assert_type() == AssertType::AssertValue) {
            auto *st = reinterpret_cast<AssertValueStmt *>(stmt);
            st->set_else(else_stmt);
        } else {
            auto st = stmt->as<AssertPropertyStmt>();
            auto *prop = st->property();
            if (prop->action() == PropertyAction::Assert) {
                st->set_else(else_stmt);
            }
        }
    }